

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newpfor.h
# Opt level: O3

void __thiscall
FastPForLib::NewPFor<4U,_FastPForLib::Simple16<false>_>::encodeArray
          (NewPFor<4U,_FastPForLib::Simple16<false>_> *this,uint32_t *in,size_t len,uint32_t *out,
          size_t *nvalue)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint32_t *puVar6;
  size_t csize;
  long local_38;
  
  checkifdivisibleby(len,0x80);
  uVar1 = *nvalue;
  uVar5 = (int)len + 0x7f;
  uVar3 = uVar5 >> 7;
  *out = uVar3;
  *nvalue = 1;
  uVar2 = 1;
  if (0x7f < uVar5) {
    puVar6 = out + 1;
    iVar4 = uVar3 + (uVar3 == 0);
    do {
      (*(this->super_IntegerCODEC)._vptr_IntegerCODEC[10])(this,in,puVar6,&local_38);
      in = in + 0x80;
      puVar6 = puVar6 + local_38;
      uVar2 = local_38 + *nvalue;
      iVar4 = iVar4 + -1;
      *nvalue = uVar2;
    } while (iVar4 != 0);
  }
  if (uVar1 < uVar2) {
    NewPFor<4u,FastPForLib::Simple16<false>>::encodeArray();
  }
  return;
}

Assistant:

void NewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::encodeArray(
    const uint32_t *in, const size_t len, uint32_t *out, size_t &nvalue) {
  size_t csize;
#ifndef NDEBUG
  const uint32_t *const initin(in);
  const uint32_t *const initout(out);
#endif
  checkifdivisibleby(len, BlockSize);
  const size_t initnvalue = nvalue;

  uint32_t numBlocks = div_roundup(static_cast<uint32_t>(len), BlockSize);

  /* Output the number of blocks */
  *out++ = numBlocks;
  nvalue = 1;
#ifdef STATS
  std::vector<uint32_t> stats(33, 0);
#endif
  for (uint32_t i = 0; i < numBlocks; i++) {
#ifdef STATS
    stats[findBestB(in, BlockSize)]++;
#endif

    encodeBlock(in, out, csize);
    in += BlockSize;
    out += csize;
    nvalue += csize;
  }
#ifdef STATS
  for (uint32_t k = 0; k < 33; ++k)
    printf("newpfor b=%u %u\n", k, stats[k]);
#endif
  if (nvalue > initnvalue) {
    fprintf(stderr, "we have a possible buffer overrun\n");
  }
  ASSERT(len == static_cast<size_t>(in - initin),
      std::to_string(len) + " " + std::to_string(in - initin));
  ASSERT(nvalue == static_cast<size_t>(out - initout),
      std::to_string(nvalue) + " " + std::to_string(out - initout));
}